

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_relative_indices_Test_Test::~utObjImportExport_relative_indices_Test_Test
          (utObjImportExport_relative_indices_Test_Test *this)

{
  utObjImportExport_relative_indices_Test_Test *this_local;
  
  ~utObjImportExport_relative_indices_Test_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utObjImportExport, relative_indices_Test) {
    static const char *ObjModel =
        "v -0.500000 0.000000 0.400000\n"
        "v -0.500000 0.000000 -0.800000\n"
        "v -0.500000 1.000000 -0.800000\n"
        "v -0.500000 1.000000 0.400000\n"
        "f -4 -3 -2 -1\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(scene->mNumMeshes, 1U);
    const aiMesh *mesh = scene->mMeshes[0];
    EXPECT_EQ(mesh->mNumVertices, 4U);
    EXPECT_EQ(mesh->mNumFaces, 1U);
    const aiFace face = mesh->mFaces[0];
    EXPECT_EQ(face.mNumIndices, 4U);
    for (unsigned int i = 0; i < face.mNumIndices; ++i)
    {
        EXPECT_EQ(face.mIndices[i], i);
    }

}